

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_b3lyp.c
# Opt level: O0

void rc04_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *in_RSI;
  xc_func_type *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double d;
  double ac;
  double ax;
  double a0;
  
  dVar1 = get_ext_param(in_RDI,in_RSI,0);
  dVar2 = get_ext_param(in_RDI,in_RSI,1);
  dVar3 = get_ext_param(in_RDI,in_RSI,2);
  dVar4 = get_ext_param(in_RDI,in_RSI,3);
  *in_RDI->mix_coef = (1.0 - dVar1) - dVar2;
  in_RDI->mix_coef[1] = dVar2;
  in_RDI->mix_coef[2] = -dVar4 * dVar3 + 1.0;
  in_RDI->mix_coef[3] = dVar3;
  in_RDI->cam_alpha = dVar1;
  return;
}

Assistant:

static void
rc04_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double a0, ax, ac, d;

  assert(p != NULL);

  a0 = get_ext_param(p, ext_params, 0);
  ax = get_ext_param(p, ext_params, 1);
  ac = get_ext_param(p, ext_params, 2);
  d  = get_ext_param(p, ext_params, 3);

  p->mix_coef[0] = 1.0 - a0 - ax;
  p->mix_coef[1] = ax;
  p->mix_coef[2] = 1.0 - d*ac;
  p->mix_coef[3] = ac;

  p->cam_alpha = a0;
}